

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

void helicsEndpointAddDestinationFilter(HelicsEndpoint end,char *filterName,HelicsError *err)

{
  Endpoint *this;
  undefined8 *puVar1;
  size_t sVar2;
  bool bVar3;
  string_view filterName_00;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (end == (HelicsEndpoint)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001af628;
    }
    else {
      bVar3 = *(int *)((long)end + 0x20) == -0x4bac6b3e;
      puVar1 = (undefined8 *)0x0;
      if (bVar3) {
        puVar1 = (undefined8 *)end;
      }
      if (bVar3 || err == (HelicsError *)0x0) goto LAB_001af62a;
    }
    err->error_code = -3;
    err->message = "The given endpoint does not point to a valid object";
  }
LAB_001af628:
  puVar1 = (undefined8 *)0x0;
LAB_001af62a:
  if (puVar1 != (undefined8 *)0x0) {
    this = (Endpoint *)*puVar1;
    sVar2 = strlen(filterName);
    filterName_00._M_str = filterName;
    filterName_00._M_len = sVar2;
    helics::Endpoint::addDestinationFilter(this,filterName_00);
  }
  return;
}

Assistant:

void helicsEndpointAddDestinationFilter(HelicsEndpoint end, const char* filterName, HelicsError* err)
{
    auto* endObj = verifyEndpoint(end, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        endObj->endPtr->addDestinationFilter(filterName);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}